

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk8c(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk8c *peVar4;
  envy_bios_power_unk8c_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk8c *unk8c;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk8c;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk8c.version);
    if ((bios->power).unk8c.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk8c.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk8c.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk8c.entriesnum);
      (bios->power).unk8c.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk8c_entry *)malloc((ulong)(bios->power).unk8c.entriesnum << 2);
      (bios->power).unk8c.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk8c.entriesnum; data = data + 1) {
        (bios->power).unk8c.entries[(int)data].offset =
             peVar4->offset + (uint)(bios->power).unk8c.hlen + data * (bios->power).unk8c.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER GC6 table version 0x%x\n",
              (ulong)(bios->power).unk8c.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk8c(struct envy_bios *bios) {
	struct envy_bios_power_unk8c *unk8c = &bios->power.unk8c;
	int i, err = 0;

	if (!unk8c->offset)
		return -EINVAL;

	bios_u8(bios, unk8c->offset + 0x0, &unk8c->version);
	switch(unk8c->version) {
	case 0x10:
		err |= bios_u8(bios, unk8c->offset + 0x1, &unk8c->hlen);
		err |= bios_u8(bios, unk8c->offset + 0x2, &unk8c->rlen);
		err |= bios_u8(bios, unk8c->offset + 0x3, &unk8c->entriesnum);
		unk8c->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER GC6 table version 0x%x\n", unk8c->version);
		return -EINVAL;
	};

	err = 0;
	unk8c->entries = malloc(unk8c->entriesnum * sizeof(struct envy_bios_power_unk8c_entry));
	for (i = 0; i < unk8c->entriesnum; i++) {
		uint32_t data = unk8c->offset + unk8c->hlen + i * unk8c->rlen;

		unk8c->entries[i].offset = data;
	}

	return 0;
}